

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VanEmdeBoasTree.cpp
# Opt level: O2

bool __thiscall VanEmdeBoasTree::predecessor(VanEmdeBoasTree *this,Node *root,int value,int *result)

{
  Node *root_00;
  bool bVar1;
  int value_00;
  int iVar2;
  char *pcVar3;
  VanEmdeBoasTree *this_00;
  int i;
  int local_38;
  int local_34;
  
  if ((value < 0 || root == (Node *)0x0) || (root->uni < value)) goto LAB_00108d18;
  iVar2 = root->max;
  if (iVar2 < value) {
LAB_00108de2:
    *result = iVar2;
    bVar1 = true;
  }
  else {
    if (root->summary == (Node *)0x0) {
LAB_00108dd6:
      iVar2 = root->min;
      if (iVar2 < value) goto LAB_00108de2;
    }
    else {
      this_00 = this;
      value_00 = low(this,root,value);
      iVar2 = high(this_00,root,value);
      _local_38 = CONCAT44(0x80000000,iVar2);
      root_00 = root->cluster[iVar2];
      if ((root_00 == (Node *)0x0) || (value_00 <= root_00->min)) {
        bVar1 = predecessor(this,root->summary,iVar2,&local_38);
        if (!bVar1) goto LAB_00108dd6;
        iVar2 = local_38;
        if (root->cluster[local_38] != (Node *)0x0) goto LAB_00108dc6;
      }
      else {
        bVar1 = predecessor(this,root_00,value_00,&local_34);
        if (bVar1) {
LAB_00108dc6:
          pcVar3 = index(this,(char *)root,iVar2);
          iVar2 = (int)pcVar3;
          goto LAB_00108de2;
        }
      }
    }
LAB_00108d18:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool VanEmdeBoasTree::predecessor(Node *root, int value, int &result) {
    if (!root) {
        return false;
    }

    if (value < 0 || value > root->uni) {
        return false;
    }

    if (root->max < value) {
        result = root->max;
        return true;
    }

    if (!root->summary) {
        if (root->min < value) {
            result = root->min;
            return true;
        }
        return false;
    }

    int lowVal = low(root, value);
    int highVal = high(root, value);
    int i = highVal;
    int j = INT_MIN;
    int tmp;
    if (findMin(root->cluster[i], tmp) && lowVal > tmp) {
        if (!predecessor(root->cluster[i], lowVal, j)) {
            return false;
        }
    } else {
        if (!predecessor(root->summary, highVal, i)) {
            if (root->min < value) {
                result = root->min;
                return true;
            }
            return false;
        }
        if (!findMax(root->cluster[i], j)) return false;
    }

    result = index(root, i, j);
    return true;
}